

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void boost::unordered::detail::foa::rw_spinlock::yield(uint k)

{
  uint i;
  uint uVar1;
  uint uVar2;
  
  uVar2 = k & 0x3ff;
  if (uVar2 < 5) {
    for (uVar1 = 0; uVar1 >> ((byte)uVar2 & 0x1f) == 0; uVar1 = uVar1 + 1) {
    }
    return;
  }
  if (uVar2 == 0x3ff) {
    core::sp_thread_sleep();
    return;
  }
  sched_yield();
  return;
}

Assistant:

static void yield(unsigned k) noexcept {
        unsigned const sleep_every = 1024; // see below

        k %= sleep_every;

        if (k < 5) {
            // Intel recommendation from the Optimization Reference Manual
            // Exponentially increase number of PAUSE instructions each
            // iteration until reaching a maximum which is approximately
            // one timeslice long (2^4 == 16 in our case)

            unsigned const pause_count = 1u << k;

            for (unsigned i = 0; i < pause_count; ++i) {
                boost::core::sp_thread_pause();
            }
        }
        else if (k < sleep_every - 1) {
            // Once the maximum number of PAUSE instructions is reached,
            // we switch to yielding the timeslice immediately

            boost::core::sp_thread_yield();
        }
        else {
            // After `sleep_every` iterations of no progress, we sleep,
            // to avoid a deadlock if a lower priority thread has the lock

            boost::core::sp_thread_sleep();
        }
    }